

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O3

void __thiscall gflags::AddXMLTag(gflags *this,string *r,char *tag,string *txt)

{
  string local_38;
  
  XMLText(&local_38,(gflags *)tag,txt);
  StringAppendF((string *)this,"<%s>%s</%s>",r,local_38._M_dataplus._M_p,r);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void AddXMLTag(string* r, const char* tag, const string& txt) {
  StringAppendF(r, "<%s>%s</%s>", tag, XMLText(txt).c_str(), tag);
}